

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O3

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  string *psVar1;
  pointer *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ParameterSet *pPVar8;
  pointer pVVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  BaseHandle BVar14;
  bool bVar15;
  int iVar16;
  Index IVar17;
  Index IVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  uint uVar22;
  char *pcVar23;
  MeshDenoisingBase *pMVar24;
  pointer *this_01;
  ulong uVar25;
  long lVar26;
  size_t *psVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  FaceIter FVar32;
  undefined1 local_590 [8];
  SparseMatrix<double,_0,_int> weight_matrix;
  SparseMatrix<double,_0,_int> normalize_matrix;
  SparseMatrix<double,_0,_int> identity_matrix;
  SparseMatrix<double,_0,_int> coef_matrix;
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  undefined1 local_460 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  double multiple_radius;
  double multiple_sigma_s;
  double sigma_r;
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  undefined1 local_1b8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  SparseMatrix<double,_0,_int> matrix;
  MatrixX3d filtered_normals_matrix;
  undefined1 auStack_128 [8];
  MatrixXd right_term;
  CompressedStorage<double,_int> local_100;
  pointer *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  int local_bc;
  int local_b8;
  int face_neighbor_index;
  int vertex_iteration_number;
  double smoothness;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_a0;
  pointer pTStack_98;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> coef_triple;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_78;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> weight_triple;
  int local_54;
  double dStack_50;
  int normal_iteration_number;
  Index *local_48;
  MeshDenoisingBase *local_40;
  bool local_31 [8];
  bool include_central_face;
  
  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       + 0x28))(mesh);
  local_a0 = filtered_normals;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar16);
  pPVar8 = (this->super_MeshDenoisingBase).parameter_set_;
  psVar1 = &solver.m_lastError;
  local_460 = (undefined1  [8])psVar1;
  local_40 = &this->super_MeshDenoisingBase;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"Face Neighbor","");
  bVar15 = ParameterSet::getValue(pPVar8,(string *)local_460,&local_bc);
  if (local_460 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_460);
  }
  if (bVar15) {
    pPVar8 = local_40->parameter_set_;
    local_460 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"include central face","");
    bVar15 = ParameterSet::getValue(pPVar8,(string *)local_460,local_31);
    if (local_460 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_460);
    }
    if (bVar15) {
      pPVar8 = local_40->parameter_set_;
      local_460 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_460,"Multiple(* avg face dis.)","");
      bVar15 = ParameterSet::getValue
                         (pPVar8,(string *)local_460,
                          (double *)
                          &all_guided_neighbor.
                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_460 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_460);
      }
      if (bVar15) {
        pPVar8 = local_40->parameter_set_;
        local_460 = (undefined1  [8])psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_460,"Multiple(* sigma_s)","");
        bVar15 = ParameterSet::getValue(pPVar8,(string *)local_460,&multiple_radius);
        if (local_460 != (undefined1  [8])psVar1) {
          operator_delete((void *)local_460);
        }
        if (bVar15) {
          pPVar8 = local_40->parameter_set_;
          local_460 = (undefined1  [8])psVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_460,"(Global)Normal Iteration Num.","");
          bVar15 = ParameterSet::getValue(pPVar8,(string *)local_460,&local_54);
          if (local_460 != (undefined1  [8])psVar1) {
            operator_delete((void *)local_460);
          }
          if (bVar15) {
            pPVar8 = local_40->parameter_set_;
            local_460 = (undefined1  [8])psVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"sigma_r","");
            bVar15 = ParameterSet::getValue(pPVar8,(string *)local_460,&multiple_sigma_s);
            if (local_460 != (undefined1  [8])psVar1) {
              operator_delete((void *)local_460);
            }
            if (bVar15) {
              pPVar8 = local_40->parameter_set_;
              local_460 = (undefined1  [8])psVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"smoothness","");
              bVar15 = ParameterSet::getValue
                                 (pPVar8,(string *)local_460,(double *)&vertex_iteration_number);
              if (local_460 != (undefined1  [8])psVar1) {
                operator_delete((void *)local_460);
              }
              if (bVar15) {
                pPVar8 = local_40->parameter_set_;
                local_460 = (undefined1  [8])psVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_460,"Vertex Iteration Num.","");
                bVar15 = ParameterSet::getValue(pPVar8,(string *)local_460,&local_b8);
                if (local_460 != (undefined1  [8])psVar1) {
                  operator_delete((void *)local_460);
                }
                if (bVar15) {
                  local_48 = (Index *)CONCAT71(local_48._1_7_,local_bc == 0);
                  coef_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  pTStack_98 = (pointer)0x0;
                  coef_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  weight_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  pDStack_78 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
                  weight_triple.
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  IVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  IVar18 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)local_590,IVar17,IVar18);
                  IVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  IVar18 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&weight_matrix.m_data.m_allocatedSize,
                             IVar17,IVar18);
                  IVar17 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  IVar18 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize,IVar17,IVar18);
                  Eigen::SparseMatrix<double,_0,_int>::setIdentity
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize);
                  if (local_bc == 0) {
                    dStack_50 = getRadius((GuidedMeshNormalFiltering *)local_40,
                                          (double)all_guided_neighbor.
                                                  super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          ,mesh);
                  }
                  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)&solver.m_detPermR,(long)iVar16,(allocator_type *)local_460);
                  getAllFaceNeighborGMNF
                            ((GuidedMeshNormalFiltering *)local_40,mesh,(uint)(byte)local_48 * 2,
                             dStack_50,local_31[0],
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)&solver.m_detPermR);
                  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)&all_face_neighbor.
                               super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar16,
                           (allocator_type *)local_460);
                  pMVar24 = local_40;
                  getAllGuidedNeighborGMNF
                            ((GuidedMeshNormalFiltering *)local_40,mesh,
                             (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                              *)&all_face_neighbor.
                                 super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  MeshDenoisingBase::getFaceNormal(pMVar24,mesh,local_a0);
                  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)&sigma_r,(long)iVar16,
                             (allocator_type *)local_460);
                  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)local_1b8,(long)iVar16,(allocator_type *)local_460);
                  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)&face_centroid.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar16,
                           (allocator_type *)local_460);
                  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,(long)iVar16,
                           (allocator_type *)local_460);
                  iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       + 0x28))(mesh);
                  std::
                  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                  ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                            *)&coef_matrix.m_data.m_allocatedSize,(long)iVar16,
                           (allocator_type *)local_460);
                  if (0 < local_54) {
                    iVar16 = 0;
                    do {
                      pMVar24 = local_40;
                      face_neighbor_index = iVar16;
                      MeshDenoisingBase::getFaceCentroid
                                (local_40,mesh,
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)local_1b8);
                      smoothness = getSigmaS((GuidedMeshNormalFiltering *)pMVar24,multiple_radius,
                                             (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              *)local_1b8,mesh);
                      MeshDenoisingBase::getFaceArea
                                (local_40,mesh,(vector<double,_std::allocator<double>_> *)&sigma_r);
                      MeshDenoisingBase::getFaceNormal
                                (local_40,mesh,
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)&face_centroid.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      this_01 = &range_and_mean_normal.
                                 super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      std::
                      vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                      ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                *)this_01,
                               (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                *)&coef_matrix.m_data.m_allocatedSize);
                      getGuidedNormals((GuidedMeshNormalFiltering *)this_01,mesh,
                                       (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                        *)&all_face_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<double,_std::allocator<double>_> *)&sigma_r,
                                       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        *)&face_centroid.
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                        *)&range_and_mean_normal.
                                           super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        *)&face_area.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (range_and_mean_normal.
                          super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                        operator_delete(range_and_mean_normal.
                                        super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                      if (coef_triple.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != pTStack_98) {
                        coef_triple.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = pTStack_98;
                      }
                      if ((DenseStorage<double,__1,__1,__1,_0> *)
                          weight_triple.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != pDStack_78) {
                        weight_triple.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)pDStack_78;
                      }
                      FVar32 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
                      auStack_128[0] = FVar32.mesh_._0_1_;
                      auStack_128._1_7_ = FVar32.mesh_._1_7_;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._0_4_ = (int)FVar32.hnd_.super_BaseHandle.idx_;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._4_4_ = FVar32.skip_bits_;
                      smoothness = smoothness * smoothness;
                      while( true ) {
                        psVar27 = &weight_matrix.m_data.m_allocatedSize;
                        FVar32 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
                        BVar14.idx_ = right_term.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_data._0_4_;
                        if ((BaseHandle)
                            right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data._0_4_ ==
                            FVar32.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
                            (mesh_ptr)CONCAT71(auStack_128._1_7_,auStack_128[0]) == FVar32.mesh_)
                        break;
                        lVar19 = (long)right_term.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_data._0_4_;
                        dVar2 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar19 * 3];
                        dVar3 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar19 * 3 + 1];
                        dVar4 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[lVar19 * 3 + 2];
                        dVar5 = (((pointer)((long)local_1b8 + lVar19 * 0x18))->
                                super_VectorDataT<double,_3>).values_[0];
                        dVar6 = (((pointer)((long)local_1b8 + lVar19 * 0x18))->
                                super_VectorDataT<double,_3>).values_[1];
                        dVar7 = (((pointer)((long)local_1b8 + lVar19 * 0x18))->
                                super_VectorDataT<double,_3>).values_[2];
                        std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                        vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)local_460,
                               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)(lVar19 * 0x18 + solver._472_8_));
                        if ((int)((ulong)(CONCAT44(solver._4_4_,solver.m_info) - (long)local_460) >>
                                 2) < 1) {
                          dStack_50 = 0.0;
                        }
                        else {
                          dStack_50 = 0.0;
                          lVar19 = 0;
                          do {
                            iVar16 = *(int *)((long)(double **)local_460 + lVar19 * 4);
                            lVar26 = (long)iVar16;
                            dVar28 = dVar5 - (((pointer)((long)local_1b8 + lVar26 * 0x18))->
                                             super_VectorDataT<double,_3>).values_[0];
                            dVar29 = dVar6 - (((pointer)((long)local_1b8 + lVar26 * 0x18))->
                                             super_VectorDataT<double,_3>).values_[1];
                            dVar31 = dVar7 - (((pointer)((long)local_1b8 + lVar26 * 0x18))->
                                             super_VectorDataT<double,_3>).values_[2];
                            dVar30 = SQRT(dVar31 * dVar31 + dVar28 * dVar28 + dVar29 * dVar29);
                            dVar28 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage[lVar26 * 3];
                            dVar29 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage
                                     [lVar26 * 3 + 1];
                            dVar31 = face_area.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage
                                     [lVar26 * 3 + 2];
                            local_48 = (Index *)exp((dVar30 * -0.5 * dVar30) / smoothness);
                            dVar28 = SQRT((dVar4 - dVar31) * (dVar4 - dVar31) +
                                          (dVar2 - dVar28) * (dVar2 - dVar28) +
                                          (dVar3 - dVar29) * (dVar3 - dVar29));
                            dVar28 = exp((dVar28 * -0.5 * dVar28) /
                                         (multiple_sigma_s * multiple_sigma_s));
                            local_48 = (Index *)((double)local_48 *
                                                 *(double *)((long)sigma_r + lVar26 * 8) * dVar28);
                            previous_normals.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = BVar14.idx_;
                            previous_normals.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar16;
                            matrix._0_8_ = local_48;
                            if (coef_triple.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start ==
                                coef_triple.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) {
                              std::
                              vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                              ::_M_realloc_insert<Eigen::Triplet<double,int>>
                                        ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                                          *)&pTStack_98,
                                         (iterator)
                                         coef_triple.
                                         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                         (Triplet<double,_int> *)
                                         &previous_normals.
                                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            }
                            else {
                              (coef_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_row = BVar14.idx_;
                              (coef_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_col = iVar16;
                              (coef_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_value =
                                   (double)local_48;
                              coef_triple.
                              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   coef_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1;
                            }
                            dStack_50 = dStack_50 + (double)local_48;
                            lVar19 = lVar19 + 1;
                          } while (lVar19 < (int)((ulong)(CONCAT44(solver._4_4_,solver.m_info) -
                                                         (long)local_460) >> 2));
                        }
                        matrix._0_8_ = 1.0 / dStack_50;
                        previous_normals.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = BVar14.idx_;
                        previous_normals.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = BVar14.idx_;
                        if (weight_triple.
                            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                            weight_triple.
                            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          std::
                          vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                          ::_M_realloc_insert<Eigen::Triplet<double,int>>
                                    ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>
                                      *)&pDStack_78,
                                     (iterator)
                                     weight_triple.
                                     super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (Triplet<double,_int> *)
                                     &previous_normals.
                                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        }
                        else {
                          (weight_triple.
                           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_row = BVar14.idx_;
                          (weight_triple.
                           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_col = BVar14.idx_;
                          (weight_triple.
                           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_value =
                               (double)matrix._0_8_;
                          weight_triple.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               weight_triple.
                               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1;
                        }
                        if (local_460 != (undefined1  [8])0x0) {
                          operator_delete((void *)local_460);
                        }
                        right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data._0_4_ =
                             right_term.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data._0_4_ + 1;
                        if (right_term.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data._4_4_ != 0) {
                          OpenMesh::Iterators::
                          GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                      *)auStack_128);
                        }
                      }
                      local_460 = (undefined1  [8])pTStack_98;
                      auStack_128[0] =
                           SUB81(coef_triple.
                                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0);
                      auStack_128._1_7_ =
                           (undefined7)
                           ((ulong)coef_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 8);
                      Eigen::internal::
                      set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
                                ((__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)local_460,
                                 (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)auStack_128,(SparseMatrix<double,_0,_int> *)local_590,0);
                      local_460 = (undefined1  [8])pDStack_78;
                      auStack_128[0] =
                           SUB81(weight_triple.
                                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0);
                      auStack_128._1_7_ =
                           (undefined7)
                           ((ulong)weight_triple.
                                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 8);
                      Eigen::internal::
                      set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
                                ((__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)local_460,
                                 (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                  *)auStack_128,(SparseMatrix<double,_0,_int> *)psVar27,0);
                      auStack_128[0] = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows = (DenseIndex)local_590;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols = 0;
                      this_00 = &previous_normals.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      if (weight_matrix.m_data.m_allocatedSize._4_4_ != weight_matrix._0_4_) {
                        pcVar23 = 
                        "void Eigen::SparseSparseProduct<const Eigen::SparseMatrix<double> &, const Eigen::SparseMatrix<double> &>::init() [Lhs = const Eigen::SparseMatrix<double> &, Rhs = const Eigen::SparseMatrix<double> &]"
                        ;
LAB_0015de2f:
                        right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data = (double *)psVar27;
                        __assert_fail("m_lhs.cols() == m_rhs.rows()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseProduct.h"
                                      ,0x85,pcVar23);
                      }
                      local_460 = (undefined1  [8])((ulong)local_460 & 0xffffffffffffff00);
                      solver._0_8_ = &normalize_matrix.m_data.m_allocatedSize;
                      solver.m_lastError._M_dataplus._M_p._0_4_ =
                           (uint)solver.m_lastError._M_dataplus._M_p & 0xffffff00;
                      solver.m_lastError._M_dataplus._M_p._4_4_ = 0;
                      solver.m_lastError._M_string_length._0_4_ = 0;
                      solver.m_mat.m_outerIndex = (Index *)0x0;
                      solver.m_mat.m_innerNonZeros = (Index *)0x0;
                      solver.m_mat.super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                      m_isRValue = false;
                      solver.m_mat._1_3_ = 0;
                      solver.m_mat.m_outerSize = 0;
                      solver.m_mat.m_innerSize = 0;
                      solver.m_mat._12_4_ = 0;
                      solver.m_lastError.field_2._M_allocated_capacity = 0;
                      solver.m_lastError.field_2._8_8_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data = (double *)psVar27;
                      Eigen::
                      SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                      ::evalTo<Eigen::SparseMatrix<double,0,int>>
                                ((SparseSparseProduct<Eigen::SparseMatrix<double,0,int>const&,Eigen::SparseMatrix<double,0,int>const&>
                                  *)auStack_128,(SparseMatrix<double,_0,_int> *)&solver.m_lastError)
                      ;
                      if ((identity_matrix._0_4_ !=
                           *(int *)(right_term.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data + 1)) ||
                         (normalize_matrix.m_data.m_allocatedSize._4_4_ !=
                          *(int *)(right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_rows + 4))) {
                        pcVar23 = 
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::SparseMatrix<double>, const Eigen::SparseSparseProduct<const Eigen::SparseMatrix<double> &, const Eigen::SparseMatrix<double> &>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::SparseMatrix<double>, Rhs = const Eigen::SparseSparseProduct<const Eigen::SparseMatrix<double> &, const Eigen::SparseMatrix<double> &>]"
                        ;
LAB_0015ddda:
                        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseBinaryOp.h"
                                      ,0x83,pcVar23);
                      }
                      previous_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                           (uint)previous_normals.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
                      previous_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      matrix.super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue
                           = false;
                      matrix._1_3_ = 0;
                      matrix.m_data.m_indices = (Index *)0x0;
                      matrix.m_data.m_size = 0;
                      matrix.m_innerNonZeros = (Index *)0x0;
                      matrix.m_data.m_values = (Scalar_conflict *)0x0;
                      matrix.m_innerSize = 0;
                      matrix._12_4_ = 0;
                      matrix.m_outerIndex = (Index *)0x0;
                      Eigen::SparseMatrix<double,0,int>::operator=
                                ((SparseMatrix<double,0,int> *)this_00,
                                 (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>_>
                                  *)local_460);
                      free((void *)solver.m_lastError.field_2._M_allocated_capacity);
                      free((void *)solver.m_lastError.field_2._8_8_);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)&solver.m_mat);
                      matrix.m_data.m_allocatedSize =
                           matrix.m_data.m_allocatedSize & 0xffffffffffffff00;
                      auStack_128[0] = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._0_4_ =
                           right_term.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data._0_4_ & 0xffffff00;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._4_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows._0_4_ = 0;
                      local_100.m_size = 0;
                      local_100.m_allocatedSize = 0;
                      local_100.m_values = (Scalar_conflict *)0x0;
                      local_100.m_indices = (Index *)0x0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols = 0;
                      Eigen::SparseMatrix<double,0,int>::operator=
                                ((SparseMatrix<double,0,int> *)&right_term,
                                 (SparseMatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Transpose<Eigen::SparseMatrix<double,_0,_int>_>_>_>
                                  *)&matrix.m_data.m_allocatedSize);
                      uVar11._4_4_ = matrix.m_outerSize;
                      uVar11._0_1_ = matrix.
                                     super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                                     m_isRValue;
                      uVar11._1_3_ = matrix._1_3_;
                      psVar27 = (size_t *)
                                CONCAT44(right_term.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_data._4_4_,
                                         right_term.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_data._0_4_);
                      local_d8 = 0;
                      local_d0 = 1;
                      local_e0 = this_00;
                      if (right_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data._4_4_ != matrix._0_4_) {
                        pcVar23 = 
                        "void Eigen::SparseSparseProduct<Eigen::SparseMatrix<double>, const Eigen::SparseMatrix<double> &>::init() [Lhs = Eigen::SparseMatrix<double>, Rhs = const Eigen::SparseMatrix<double> &]"
                        ;
                        matrix._0_8_ = uVar11;
                        goto LAB_0015de2f;
                      }
                      local_48 = _vertex_iteration_number;
                      local_460 = (undefined1  [8])((ulong)local_460 & 0xffffffffffffff00);
                      solver.m_info = solver.m_info & 0xffffff00;
                      solver.m_isInitialized = false;
                      solver.m_factorizationIsOk = false;
                      solver.m_analysisIsOk = false;
                      solver._7_1_ = 0;
                      solver.m_lastError._M_dataplus._M_p._0_4_ = 0;
                      solver.m_mat.m_innerSize = 0;
                      solver.m_mat._12_4_ = 0;
                      solver.m_mat.m_outerIndex = (Index *)0x0;
                      solver.m_lastError.field_2._8_8_ = 0;
                      solver.m_mat.super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                      m_isRValue = false;
                      solver.m_mat._1_3_ = 0;
                      solver.m_mat.m_outerSize = 0;
                      solver.m_lastError._M_string_length._0_4_ = 0;
                      solver.m_lastError._M_string_length._4_4_ = 0;
                      solver.m_lastError.field_2._M_allocated_capacity = 0;
                      Eigen::
                      SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>
                      ::evalTo<Eigen::SparseMatrix<double,0,int>>
                                ((SparseSparseProduct<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>const&>
                                  *)auStack_128,(SparseMatrix<double,_0,_int> *)&solver);
                      uVar13._4_4_ = matrix.m_outerSize;
                      uVar13._0_1_ = matrix.
                                     super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.
                                     m_isRValue;
                      uVar13._1_3_ = matrix._1_3_;
                      uVar12._4_1_ = solver.m_isInitialized;
                      uVar12._5_1_ = solver.m_factorizationIsOk;
                      uVar12._6_1_ = solver.m_analysisIsOk;
                      uVar12._7_1_ = solver._7_1_;
                      uVar12._0_4_ = solver.m_info;
                      solver.m_mat.m_innerNonZeros =
                           (Index *)((ulong)solver.m_mat.m_innerNonZeros & 0xffffffffffffff00);
                      solver.m_mat.m_data.m_values =
                           (Scalar_conflict *)&normalize_matrix.m_data.m_allocatedSize;
                      solver.m_mat.m_data.m_indices = local_48;
                      if (((int)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows != identity_matrix._0_4_) ||
                         (*(int *)((long)local_e0 + 4) !=
                          normalize_matrix.m_data.m_allocatedSize._4_4_)) {
                        pcVar23 = 
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::SparseSparseProduct<Eigen::SparseMatrix<double>, const Eigen::SparseMatrix<double> &>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::SparseMatrix<double>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::SparseSparseProduct<Eigen::SparseMatrix<double>, const Eigen::SparseMatrix<double> &>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::SparseMatrix<double>>]"
                        ;
                        solver._0_8_ = uVar12;
                        matrix._0_8_ = uVar13;
                        goto LAB_0015ddda;
                      }
                      identity_matrix.m_data.m_allocatedSize._0_1_ = 0;
                      stack0xfffffffffffffb34 = 0;
                      coef_matrix.m_data.m_indices = (Index *)0x0;
                      coef_matrix.m_data.m_size = 0;
                      coef_matrix.m_innerNonZeros = (Index *)0x0;
                      coef_matrix.m_data.m_values = (Scalar_conflict *)0x0;
                      coef_matrix.m_innerSize = 0;
                      coef_matrix._12_4_ = 0;
                      coef_matrix.m_outerIndex = (Index *)0x0;
                      Eigen::SparseMatrix<double,0,int>::operator=
                                ((SparseMatrix<double,0,int> *)
                                 &identity_matrix.m_data.m_allocatedSize,
                                 (SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::SparseSparseProduct<Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_&>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>_>
                                  *)local_460);
                      free((void *)CONCAT44(solver.m_lastError._M_string_length._4_4_,
                                            (undefined4)solver.m_lastError._M_string_length));
                      free((void *)solver.m_lastError.field_2._M_allocated_capacity);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)
                                 ((long)&solver.m_lastError.field_2 + 8));
                      free((void *)right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_cols);
                      free((void *)0x0);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                (&local_100);
                      iVar16 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                                                                                            
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                           + 0x28))(mesh);
                      auStack_128[0] = 0;
                      auStack_128._1_7_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._0_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data._4_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows._0_4_ = 0;
                      right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows._4_4_ = 0;
                      lVar19 = (long)iVar16;
                      if (lVar19 < 0) {
                        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                                      ,0xf1,
                                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                ((DenseStorage<double,__1,__1,__1,_0> *)auStack_128,lVar19 * 3,
                                 lVar19,3);
                      uVar22 = (int)((long)previous_normals.
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)face_centroid.
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3)
                               * -0x55555555;
                      if (0 < (int)uVar22) {
                        lVar19 = CONCAT71(auStack_128._1_7_,auStack_128[0]);
                        lVar26 = CONCAT44(right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_data._4_4_,
                                          right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_data._0_4_);
                        uVar10 = CONCAT44(right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_rows._4_4_,
                                          (int)right_term.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_rows);
                        pdVar20 = ((face_centroid.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super_VectorDataT<double,_3>).values_ + 2;
                        uVar25 = 0;
                        do {
                          if ((((lVar26 <= (long)uVar25) || ((long)uVar10 < 1)) ||
                              (*(double *)(lVar19 + uVar25 * 8) =
                                    ((VectorDataT<double,_3> *)(pdVar20 + -2))->values_[0],
                              uVar10 == 1)) ||
                             (*(double *)(lVar19 + lVar26 * 8 + uVar25 * 8) = pdVar20[-1],
                             uVar10 < 3)) {
                            pcVar23 = 
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                            ;
                            goto LAB_0015dda4;
                          }
                          *(double *)(lVar26 * 0x10 + lVar19 + uVar25 * 8) = *pdVar20;
                          uVar25 = uVar25 + 1;
                          pdVar20 = pdVar20 + 3;
                        } while ((uVar22 & 0x7fffffff) != uVar25);
                      }
                      solver.m_info = (ComputationInfo)_vertex_iteration_number;
                      solver._4_4_ = SUB84((ulong)_vertex_iteration_number >> 0x20,0);
                      local_460 = (undefined1  [8])auStack_128;
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                      lazyAssign<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)auStack_128
                                 ,(DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                   *)local_460);
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                *)local_460);
                      psVar27 = &identity_matrix.m_data.m_allocatedSize;
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      analyzePattern((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                      *)local_460,(MatrixType *)psVar27);
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      factorize((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                 *)local_460,(MatrixType *)psVar27);
                      if (local_460[5] == false) {
                        __assert_fail("m_factorizationIsOk && \"SparseLU is not initialized.\"",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                                      ,0xb4,
                                      "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      if (CONCAT44(right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data._4_4_,
                                   right_term.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data._0_4_) != (long)(int)solver.m_mat._0_4_) {
                        __assert_fail("rows()==B.rows() && \"SparseLU::solve(): invalid number of rows of the right hand side matrix B\""
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                                      ,0xb6,
                                      "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                                     );
                      }
                      matrix.m_data.m_allocatedSize = 0;
                      psVar27 = &matrix.m_data.m_allocatedSize;
                      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::resize
                                ((PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)psVar27
                                 ,(long)(int)solver.m_lastError.field_2._12_4_,
                                 CONCAT44(right_term.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_rows._4_4_,
                                          (int)right_term.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_rows));
                      Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                      ::
                      _solve<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,3,0,_1,3>>
                                ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                                  *)local_460,
                                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 auStack_128,
                                 (MatrixBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)psVar27);
                      guided_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar27;
                      Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::normalize
                                ((VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)
                                 &guided_normals.
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      iVar16 = face_neighbor_index;
                      pVVar9 = (local_a0->
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      uVar22 = (int)((long)(local_a0->
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pVVar9 >> 3) * -0x55555555;
                      if (0 < (int)uVar22) {
                        pdVar21 = (pVVar9->super_VectorDataT<double,_3>).values_ + 2;
                        lVar19 = 0;
                        pdVar20 = (double *)matrix.m_data.m_allocatedSize;
                        do {
                          if (lVar19 == 0) {
                            pcVar23 = 
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 3>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 3>, Level = 1]"
                            ;
LAB_0015dda4:
                            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                                          ,0x151,pcVar23);
                          }
                          ((VectorDataT<double,_3> *)(pdVar21 + -2))->values_[0] = *pdVar20;
                          pdVar21[-1] = *pdVar20;
                          *pdVar21 = *pdVar20;
                          lVar19 = lVar19 + -1;
                          pdVar20 = pdVar20 + 1;
                          pdVar21 = pdVar21 + 3;
                        } while (-lVar19 != (ulong)(uVar22 & 0x7fffffff));
                      }
                      MeshDenoisingBase::updateVertexPosition(local_40,mesh,local_a0,local_b8,false)
                      ;
                      free((void *)matrix.m_data.m_allocatedSize);
                      Eigen::
                      SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
                      ~SparseLU((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                                 *)local_460);
                      free((void *)CONCAT71(auStack_128._1_7_,auStack_128[0]));
                      free((void *)coef_matrix._8_8_);
                      free(coef_matrix.m_outerIndex);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)&coef_matrix.m_innerNonZeros);
                      free((void *)matrix._8_8_);
                      free(matrix.m_outerIndex);
                      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                                ((CompressedStorage<double,_int> *)&matrix.m_innerNonZeros);
                      iVar16 = iVar16 + 1;
                    } while (iVar16 < local_54);
                  }
                  if (coef_matrix.m_data.m_allocatedSize != 0) {
                    operator_delete((void *)coef_matrix.m_data.m_allocatedSize);
                  }
                  if (face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    operator_delete(face_area.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  if (face_centroid.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    operator_delete(face_centroid.
                                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  if (local_1b8 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_1b8);
                  }
                  if (sigma_r != 0.0) {
                    operator_delete((void *)sigma_r);
                  }
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)&all_face_neighbor.
                                super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             *)&solver.m_detPermR);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)
                             &normalize_matrix.m_data.m_allocatedSize);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)&weight_matrix.m_data.m_allocatedSize);
                  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                            ((SparseMatrix<double,_0,_int> *)local_590);
                  if (pDStack_78 != (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
                    operator_delete(pDStack_78);
                  }
                  if (pTStack_98 != (pointer)0x0) {
                    operator_delete(pTStack_98);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsGlobalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Global)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    double smoothness;
    if(!parameter_set_->getValue(string("smoothness"), smoothness))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    std::vector< Eigen::Triplet<double> > coef_triple;
    std::vector< Eigen::Triplet<double> > weight_triple;
    Eigen::SparseMatrix<double> weight_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> normalize_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    Eigen::SparseMatrix<double> identity_matrix((int)mesh.n_faces(), (int)mesh.n_faces());
    identity_matrix.setIdentity();

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // construct matrix
        coef_triple.clear();
        weight_triple.clear();

        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = guided_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];            
            double weight_sum = 0.0;
            for(int i = 0; i < (int)face_neighbor.size(); i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = guided_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];
                double spatial_weight = GaussianWeight((ci - cj).length(), sigma_s);
                double range_weight = GaussianWeight((ni - nj).length(), sigma_r);
                double weight = face_area[index_j] * spatial_weight * range_weight;
                coef_triple.push_back( Eigen::Triplet<double>(index_i, index_j, weight) );
                weight_sum += weight;
            }
            weight_triple.push_back( Eigen::Triplet<double>(index_i, index_i , 1.0 / weight_sum) );
        }
        weight_matrix.setFromTriplets(coef_triple.begin(), coef_triple.end());
        normalize_matrix.setFromTriplets(weight_triple.begin(), weight_triple.end());
        Eigen::SparseMatrix<double> matrix = identity_matrix - normalize_matrix * weight_matrix;
        Eigen::SparseMatrix<double> coef_matrix = (1 - smoothness) * matrix.transpose() * matrix + smoothness * identity_matrix;

        // construct right term
        Eigen::MatrixXd right_term((int)mesh.n_faces(), 3);
        for(int i = 0; i < (int)previous_normals.size(); i++)
        {
            right_term(i, 0) = previous_normals[i][0];
            right_term(i, 1) = previous_normals[i][1];
            right_term(i, 2) = previous_normals[i][2];
        }
        right_term = smoothness * right_term;

        // solve Ax = b
        Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
        solver.analyzePattern(coef_matrix);
        solver.factorize(coef_matrix);
        Eigen::MatrixX3d filtered_normals_matrix = solver.solve(right_term);
        filtered_normals_matrix.rowwise().normalize();
        for(int i = 0; i < (int)filtered_normals.size(); i++)
        {
            filtered_normals[i][0] = filtered_normals_matrix(i, 0);
            filtered_normals[i][1] = filtered_normals_matrix(i, 1);
            filtered_normals[i][2] = filtered_normals_matrix(i, 2);
        }
        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}